

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateHeader
          (EnumGenerator *this,Printer *printer)

{
  string *args_1;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  pointer ppEVar3;
  char *pcVar4;
  undefined1 prefer_single_line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  EnumValueDescriptor *extraout_RDX;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *extraout_RDX_01;
  EnumValueDescriptor *extraout_RDX_02;
  EnumValueDescriptor *extraout_RDX_03;
  EnumValueDescriptor *descriptor;
  ulong uVar9;
  string local_150;
  string comments;
  string enum_comments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  SourceLocation location;
  _Base_ptr p_Var6;
  
  enum_comments._M_dataplus._M_p = (pointer)&enum_comments.field_2;
  enum_comments._M_string_length = 0;
  enum_comments.field_2._M_local_buf[0] = '\0';
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar5 = &location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  location.trailing_comments._M_dataplus._M_p = (pointer)paVar5;
  bVar2 = EnumDescriptor::GetSourceLocation(this->descriptor_,&location);
  if (bVar2) {
    BuildCommentsString_abi_cxx11_
              (&comments,(objectivec *)&location,(SourceLocation *)0x1,SUB81(paVar5,0));
    std::__cxx11::string::operator=((string *)&enum_comments,(string *)&comments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comments._M_dataplus._M_p != &comments.field_2) {
      operator_delete(comments._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&enum_comments,0,(char *)enum_comments._M_string_length,0x3e25d9);
  }
  args_1 = &this->name_;
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"#pragma mark - Enum $name$\n\n",(char (*) [5])0x3f58c9,args_1);
  GetOptionalDeprecatedAttribute<google::protobuf::EnumDescriptor>
            (&comments,this->descriptor_,*(FileDescriptor **)(this->descriptor_ + 0x10),true,false);
  io::Printer::
  Print<char[9],std::__cxx11::string,char[21],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
             (char (*) [9])0x4434cd,&enum_comments,(char (*) [21])"deprecated_attribute",&comments,
             (char (*) [5])0x3f58c9,args_1);
  paVar5 = &comments.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comments._M_dataplus._M_p != paVar5) {
    operator_delete(comments._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') {
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "/**\n * Value used if any message\'s field encounters a value that is not defined\n * by this enum. The message will also have C functions to get/set the rawValue\n * of the field.\n **/\n$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n"
               ,(char (*) [5])0x3f58c9,args_1);
  }
  ppEVar3 = (this->all_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar3) {
    p_Var1 = &(this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header;
    uVar9 = 0;
    do {
      p_Var7 = (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      if (p_Var7 != (_Base_ptr)0x0) {
        do {
          if (*(EnumValueDescriptor **)(p_Var7 + 1) >= ppEVar3[uVar9]) {
            p_Var6 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[*(EnumValueDescriptor **)(p_Var7 + 1) < ppEVar3[uVar9]];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var6,
         ppEVar3[uVar9] < (EnumValueDescriptor *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
        p_Var6 = &p_Var1->_M_header;
        p_Var8 = p_Var1;
      }
      prefer_single_line = SUB81(p_Var6,0);
      if (p_Var8 == p_Var1) {
        bVar2 = EnumValueDescriptor::GetSourceLocation(ppEVar3[uVar9],&location);
        descriptor = extraout_RDX;
        if (bVar2) {
          BuildCommentsString_abi_cxx11_
                    (&local_150,(objectivec *)&location,(SourceLocation *)0x1,
                     (bool)prefer_single_line);
          std::__cxx11::string::string
                    ((string *)&comments,local_150._M_dataplus._M_p,(allocator *)&local_b8);
          descriptor = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
            descriptor = extraout_RDX_01;
          }
          if (comments._M_string_length != 0) {
            if (uVar9 != 0) {
              io::Printer::Print<>(printer,"\n");
            }
            io::Printer::Print<>(printer,comments._M_dataplus._M_p);
            descriptor = extraout_RDX_02;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)comments._M_dataplus._M_p != paVar5) {
            operator_delete(comments._M_dataplus._M_p);
            descriptor = extraout_RDX_03;
          }
        }
        EnumValueName_abi_cxx11_
                  (&local_150,
                   (objectivec *)
                   (this->all_values_).
                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9],descriptor);
        GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                  (&local_b8,
                   (this->all_values_).
                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9],(FileDescriptor *)0x0,true,false
                  );
        comments._M_dataplus._M_p = (pointer)paVar5;
        pcVar4 = FastInt32ToBufferLeft
                           (*(int32 *)((this->all_values_).
                                       super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar9] + 4),
                            paVar5->_M_local_buf);
        comments._M_string_length = (long)pcVar4 - (long)paVar5;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,comments._M_dataplus._M_p,
                   comments._M_dataplus._M_p + comments._M_string_length);
        io::Printer::
        Print<char[5],std::__cxx11::string,char[21],std::__cxx11::string,char[6],std::__cxx11::string>
                  (printer,"$name$$deprecated_attribute$ = $value$,\n",(char (*) [5])0x3f58c9,
                   &local_150,(char (*) [21])"deprecated_attribute",&local_b8,(char (*) [6])0x43fa60
                   ,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
      }
      uVar9 = uVar9 + 1;
      ppEVar3 = (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->all_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3))
    ;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,
             "};\n\nGPBEnumDescriptor *$name$_EnumDescriptor(void);\n\n/**\n * Checks to see if the given value is defined by the enum or was not known at\n * the time this source was generated.\n **/\nBOOL $name$_IsValidValue(int32_t value);\n\n"
             ,(char (*) [5])0x3f58c9,args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&location.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)location.trailing_comments._M_dataplus._M_p != &location.trailing_comments.field_2) {
    operator_delete(location.trailing_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)location.leading_comments._M_dataplus._M_p != &location.leading_comments.field_2) {
    operator_delete(location.leading_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)enum_comments._M_dataplus._M_p != &enum_comments.field_2) {
    operator_delete(enum_comments._M_dataplus._M_p);
  }
  return;
}

Assistant:

void EnumGenerator::GenerateHeader(io::Printer* printer) {
  std::string enum_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    enum_comments = BuildCommentsString(location, true);
  } else {
    enum_comments = "";
  }

  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  // Swift 5 included SE0192 "Handling Future Enum Cases"
  //   https://github.com/apple/swift-evolution/blob/master/proposals/0192-non-exhaustive-enums.md
  // Since a .proto file can get new values added to an enum at any time, they
  // are effectively "non-frozen". Even in a proto3 syntax file where there is
  // support for the unknown value, an edit to the file can always add a new
  // value moving something from unknown to known. Since Swift is now ABI
  // stable, it also means a binary could contain Swift compiled against one
  // version of the .pbobjc.h file, but finally linked against an enum with
  // more cases. So the Swift code will always have to treat ObjC Proto Enums
  // as "non-frozen". The default behavior in SE0192 is for all objc enums to
  // be "non-frozen" unless marked as otherwise, so this means this generation
  // doesn't have to bother with the `enum_extensibility` attribute, as the
  // default will be what is needed.

  printer->Print("$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                 "comments", enum_comments,
                 "deprecated_attribute", GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file()),
                 "name", name_);
  printer->Indent();

  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    // Include the unknown value.
    printer->Print(
      "/**\n"
      " * Value used if any message's field encounters a value that is not defined\n"
      " * by this enum. The message will also have C functions to get/set the rawValue\n"
      " * of the field.\n"
      " **/\n"
      "$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n",
      "name", name_);
  }
  for (int i = 0; i < all_values_.size(); i++) {
    if (alias_values_to_skip_.find(all_values_[i]) != alias_values_to_skip_.end()) {
      continue;
    }
    if (all_values_[i]->GetSourceLocation(&location)) {
      std::string comments = BuildCommentsString(location, true).c_str();
      if (comments.length() > 0) {
        if (i > 0) {
          printer->Print("\n");
        }
        printer->Print(comments.c_str());
      }
    }

    printer->Print(
        "$name$$deprecated_attribute$ = $value$,\n",
        "name", EnumValueName(all_values_[i]),
        "deprecated_attribute", GetOptionalDeprecatedAttribute(all_values_[i]),
        "value", StrCat(all_values_[i]->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "GPBEnumDescriptor *$name$_EnumDescriptor(void);\n"
      "\n"
      "/**\n"
      " * Checks to see if the given value is defined by the enum or was not known at\n"
      " * the time this source was generated.\n"
      " **/\n"
      "BOOL $name$_IsValidValue(int32_t value);\n"
      "\n",
      "name", name_);
}